

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

TypeGenericClass * __thiscall
ExpressionContext::GetGenericClassType
          (ExpressionContext *this,SynBase *source,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> generics)

{
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<TypeHandle> generics_01;
  uint uVar1;
  TypeGenericClass *this_00;
  bool bVar2;
  TypeGenericClass *local_98;
  ExpressionContext *local_90;
  TypeHandle *local_88;
  ExpressionContext *local_80;
  TypeHandle *local_78;
  InplaceStr local_70;
  TypeGenericClass *local_60;
  TypeGenericClass *result;
  TypeHandle *rightArg;
  TypeHandle *leftArg;
  TypeGenericClass *type;
  uint e;
  uint i;
  TypeGenericClassProto *proto_local;
  SynBase *source_local;
  ExpressionContext *this_local;
  IntrusiveList<TypeHandle> generics_local;
  
  generics_local.head = generics.tail;
  this_local = (ExpressionContext *)generics.head;
  type._4_4_ = 0;
  type._0_4_ = (this->genericClassTypes).count;
  do {
    if ((uint)type <= type._4_4_) {
      _e = proto;
      proto_local = (TypeGenericClassProto *)source;
      source_local = (SynBase *)this;
      this_00 = get<TypeGenericClass>(this);
      local_80 = this_local;
      local_78 = generics_local.head;
      generics_01.tail = generics_local.head;
      generics_01.head = (TypeHandle *)this_local;
      local_70 = GetGenericClassTypeName(this,&_e->super_TypeBase,generics_01);
      local_90 = this_local;
      local_88 = generics_local.head;
      generics_00.tail = generics_local.head;
      generics_00.head = (TypeHandle *)this_local;
      TypeGenericClass::TypeGenericClass(this_00,local_70,_e,generics_00);
      local_60 = this_00;
      uVar1 = InplaceStr::length(&(this_00->super_TypeBase).name);
      if (0x2000 < uVar1) {
        Stop(this,(SynBase *)proto_local,
             "ERROR: generated generic type name exceeds maximum type length \'%d\'",0x2000);
      }
      SmallArray<TypeGenericClass_*,_128U>::push_back(&this->genericClassTypes,&local_60);
      local_98 = local_60;
      SmallArray<TypeBase_*,_128U>::push_back(&this->types,(TypeBase **)&local_98);
      return local_60;
    }
    leftArg = (TypeHandle *)(this->genericClassTypes).data[type._4_4_];
    if (((TypeGenericClass *)leftArg != (TypeGenericClass *)0x0) &&
       (((TypeGenericClass *)leftArg)->proto == proto)) {
      rightArg = (((TypeGenericClass *)leftArg)->generics).head;
      result = (TypeGenericClass *)this_local;
      while( true ) {
        bVar2 = false;
        if ((rightArg != (TypeHandle *)0x0) && (bVar2 = false, result != (TypeGenericClass *)0x0)) {
          bVar2 = rightArg->type == (TypeBase *)(result->super_TypeBase)._vptr_TypeBase;
        }
        if (!bVar2) break;
        rightArg = rightArg->next;
        result = *(TypeGenericClass **)&(result->super_TypeBase).typeID;
      }
      if ((TypeGenericClass *)rightArg == result) {
        return (TypeGenericClass *)leftArg;
      }
    }
    type._4_4_ = type._4_4_ + 1;
  } while( true );
}

Assistant:

TypeGenericClass* ExpressionContext::GetGenericClassType(SynBase *source, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> generics)
{
	for(unsigned i = 0, e = genericClassTypes.count; i < e; i++)
	{
		if(TypeGenericClass *type = genericClassTypes.data[i])
		{
			if(type->proto != proto)
				continue;

			TypeHandle *leftArg = type->generics.head;
			TypeHandle *rightArg = generics.head;

			while(leftArg && rightArg && leftArg->type == rightArg->type)
			{
				leftArg = leftArg->next;
				rightArg = rightArg->next;
			}

			if(leftArg != rightArg)
				continue;

			return type;
		}
	}

	// Create new type
	TypeGenericClass *result = new (get<TypeGenericClass>()) TypeGenericClass(GetGenericClassTypeName(*this, proto, generics), proto, generics);

	if(result->name.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(source, "ERROR: generated generic type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	genericClassTypes.push_back(result);
	types.push_back(result);

	return result;
}